

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-splitting.cpp
# Opt level: O2

void __thiscall
wasm::ModuleSplitting::anon_unknown_0::ModuleSplitter::ModuleSplitter
          (ModuleSplitter *this,Module *primary,Config *config)

{
  _Rb_tree_header *p_Var1;
  Id IVar2;
  char cVar3;
  pointer puVar4;
  __uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_> _Var5;
  pointer puVar6;
  char *pcVar7;
  pointer puVar8;
  ElementSegment *pEVar9;
  pointer ppEVar10;
  char *pcVar11;
  pointer puVar12;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *psVar13;
  HeapType HVar14;
  Module *pMVar15;
  uintptr_t uVar16;
  pointer puVar17;
  Global *pGVar18;
  pointer ppEVar19;
  pointer puVar20;
  DataSegment *pDVar21;
  _List_node_base *p_Var22;
  pointer puVar23;
  Memory *primaryItem;
  Table *primaryItem_00;
  pointer puVar24;
  Tag *primaryItem_01;
  _List_node_base target;
  undefined1 auVar25 [16];
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  Slot slot;
  Name table;
  Name root;
  IString *pIVar29;
  Name root_00;
  string_view name;
  string_view func;
  __single_object *p_Var30;
  pair<std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>
  *ppVar31;
  bool bVar32;
  uint uVar33;
  int iVar34;
  _Rb_tree_node_base *p_Var35;
  size_type sVar36;
  size_type sVar37;
  Export *pEVar38;
  Slot *pSVar39;
  pointer puVar40;
  Const *pCVar41;
  mapped_type *pmVar42;
  Function *pFVar43;
  size_t sVar44;
  Type *pTVar45;
  Expression *pEVar46;
  CallIndirect *pCVar47;
  size_type sVar48;
  Type TVar49;
  undefined1 auVar50 [8];
  __node_base _Var51;
  mapped_type *pmVar52;
  mapped_type *ppFVar53;
  RefFunc *pRVar54;
  RefNull *pRVar55;
  Module *pMVar56;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  mapped_type *pmVar57;
  Memory *secondaryItem;
  Table *pTVar58;
  pointer puVar59;
  GlobalGet *pGVar60;
  string_view *psVar61;
  long lVar62;
  variant<wasm::Name,_wasm::HeapType> *pvVar63;
  _Rb_tree_color _Var64;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *ex;
  ulong uVar65;
  pointer puVar66;
  Builder BVar67;
  _List_node_base *p_Var68;
  long lVar69;
  _List_node_base **__x;
  _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
  *this_00;
  size_t *psVar70;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range2;
  pointer puVar71;
  pointer ppEVar72;
  pointer puVar73;
  _List_node_base *p_Var74;
  pointer puVar75;
  Index i;
  Index index;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *segment_1;
  pointer puVar76;
  pointer puVar77;
  pointer puVar78;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *segment;
  size_t i_00;
  pointer ppEVar79;
  Name name_00;
  Name name_01;
  Name name_02;
  Name name_03;
  Name name_04;
  Name name_05;
  Signature SVar80;
  Name NVar81;
  IString IVar82;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  __single_object *secondary;
  ParallelFunctionAnalysis<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  segmentReferrerCollector;
  _List_node_base local_1a0;
  size_t local_190;
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  *local_188;
  pair<std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>
  *local_180;
  TableSlotManager *local_178;
  Table **local_170;
  undefined1 auStack_168 [8];
  vector<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_> relevantRefFuncs;
  undefined1 auStack_148 [8];
  __single_object secondarySeg;
  undefined1 auStack_128 [8];
  Builder builder;
  Builder local_f0;
  Builder builder_2;
  undefined1 local_d0 [8];
  Index currBase;
  Module *local_c0;
  undefined1 auStack_b8 [8];
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> primaryFuncs;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  segmentReferrers;
  HeapType local_48;
  char *local_40;
  undefined4 extraout_var_01;
  
  this->config = config;
  std::make_unique<wasm::Module>();
  pMVar56 = (this->secondaryPtr)._M_t.
            super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
            super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
  (pMVar56->features).features = (primary->features).features;
  pMVar56->hasFeaturesSection = primary->hasFeaturesSection;
  this->primary = primary;
  this->secondary = pMVar56;
  auStack_148 = (undefined1  [8])0x0;
  secondarySeg._M_t.
  super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
  super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
  super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>,_true,_true>
       )(__uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>)0x0;
  wasm::ModuleUtils::
  ParallelFunctionAnalysis<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  ::ParallelFunctionAnalysis
            ((ParallelFunctionAnalysis<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
              *)&secondary,primary,(Func *)auStack_148);
  local_180 = &this->classifiedFuncs;
  std::_Function_base::~_Function_base((_Function_base *)auStack_148);
  primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)&segmentReferrers._M_h._M_rehash_policy._M_next_resize;
  segmentReferrers._M_h._M_buckets = (__buckets_ptr)0x1;
  segmentReferrers._M_h._M_bucket_count = 0;
  segmentReferrers._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  segmentReferrers._M_h._M_element_count =
       CONCAT44(segmentReferrers._M_h._M_element_count._4_4_,0x3f800000);
  segmentReferrers._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  segmentReferrers._M_h._M_rehash_policy._4_4_ = 0;
  segmentReferrers._M_h._M_rehash_policy._M_next_resize = 0;
  for (p_Var35 = (_Rb_tree_node_base *)segmentReferrerCollector._24_8_;
      p_Var35 != (_Rb_tree_node_base *)&segmentReferrerCollector.field_0x8;
      p_Var35 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var35)) {
    std::__detail::
    _Insert_base<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    insert<__gnu_cxx::__normal_iterator<wasm::Name*,std::vector<wasm::Name,std::allocator<wasm::Name>>>>
              ((_Insert_base<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (Name *)p_Var35[1]._M_parent,(Name *)p_Var35[1]._M_left);
  }
  primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&primaryFuncs;
  primaryFuncs._M_t._M_impl._0_4_ = 0;
  primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  builder.wasm = builder.wasm & 0xffffffff00000000;
  puVar4 = (primary->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  for (puVar71 = (primary->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar31 = local_180, puVar71 != puVar4;
      puVar71 = puVar71 + 1) {
    pFVar43 = (puVar71->_M_t).
              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    if ((((*(char **)((long)&(pFVar43->super_Importable).module + 8) != (char *)0x0) ||
         (sVar36 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::count
                             (&config->secondaryFuncs,(key_type *)pFVar43), sVar36 == 0)) ||
        ((config->jspi == true &&
         (bVar32 = ExportUtils::isExported
                             (primary,(puVar71->_M_t).
                                      super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                      .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl),
         bVar32)))) ||
       (sVar37 = std::
                 _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)&primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (key_type *)
                         (puVar71->_M_t).
                         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                         .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl), sVar37 != 0)
       ) {
      pFVar43 = (puVar71->_M_t).
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      this_00 = (_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                 *)auStack_b8;
    }
    else {
      pFVar43 = (puVar71->_M_t).
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      this_00 = (_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                 *)auStack_128;
      if (*(char **)((long)&(pFVar43->super_Importable).super_Named + 8) ==
          (primary->start).super_IString.str._M_str) {
        __assert_fail("func->name != primary.start && \"The start function must be kept\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-splitting.cpp"
                      ,0x1ce,
                      "static std::pair<std::set<Name>, std::set<Name>> wasm::ModuleSplitting::(anonymous namespace)::ModuleSplitter::classifyFunctions(Module &, const Config &)"
                     );
      }
    }
    std::
    _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
    ::_M_insert_unique<wasm::Name_const&>(this_00,(Name *)pFVar43);
  }
  std::
  pair<std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>
  ::
  pair<std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>,_true>
            (local_180,
             (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)auStack_b8,
             (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)auStack_128);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)auStack_128);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)auStack_b8);
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
               *)&segmentReferrerCollector);
  this->primaryFuncs = &ppVar31->first;
  this->secondaryFuncs = &(this->classifiedFuncs).second;
  (this->tableManager).module = primary;
  (this->tableManager).funcIndices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->tableManager).funcIndices._M_t._M_impl.super__Rb_tree_header;
  (this->tableManager).funcIndices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->tableManager).activeTable = (Table *)0x0;
  (this->tableManager).activeSegment = (ElementSegment *)0x0;
  (this->tableManager).activeBase.tableName.super_IString.str._M_len = 0;
  (this->tableManager).activeBase.tableName.super_IString.str._M_str = (char *)0x0;
  (this->tableManager).activeBase.global.super_IString.str._M_len = 0;
  (this->tableManager).activeBase.global.super_IString.str._M_str = (char *)0x0;
  (this->tableManager).activeBase.index = 0;
  (this->tableManager).funcIndices._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->tableManager).funcIndices._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  local_c0 = (Module *)&(this->tableManager).activeTableSegments;
  (this->tableManager).funcIndices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->tableManager).activeTableSegments.
  super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tableManager).activeTableSegments.
  super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tableManager).activeTableSegments.
  super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Name::Name((Name *)auStack_b8,"__indirect_function_table");
  NVar81.super_IString.str._M_str._0_4_ = primaryFuncs._M_t._M_impl._0_4_;
  NVar81.super_IString.str._M_len = (size_t)auStack_b8;
  NVar81.super_IString.str._M_str._4_4_ = primaryFuncs._M_t._M_impl._4_4_;
  pEVar38 = Module::getExportOrNull(primary,NVar81);
  puVar40 = (primary->tables).
            super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (((((long)(primary->tables).
               super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)puVar40 == 8) &&
       (_Var5._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
        super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl =
             (puVar40->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
             _M_t,
       (_Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>)
       _Var5._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
       super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl != (Table *)0x0)) &&
      (*(long *)((long)_Var5._M_t.
                       super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                       super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x20) != 0)) &&
     (IString::IString((IString *)&secondary,"env"),
     *(long *)((long)_Var5._M_t.
                     super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                     super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x20) ==
     CONCAT44(segmentReferrerCollector.wasm._4_4_,segmentReferrerCollector.wasm._0_4_))) {
    IString::IString((IString *)&primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     "__indirect_function_table");
    bVar32 = *(__buckets_ptr *)
              ((long)_Var5._M_t.
                     super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                     super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x30) ==
             segmentReferrers._M_h._M_buckets;
  }
  else {
    bVar32 = false;
  }
  local_178 = &this->tableManager;
  local_170 = &(this->tableManager).activeTable;
  if (((!bVar32) && (pEVar38 == (Export *)0x0)) && (((primary->features).features & 0x100) != 0))
  goto LAB_009230b2;
  pSVar39 = &(this->tableManager).activeBase;
  puVar40 = (primary->tables).
            super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar6 = (primary->tables).
           super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar62 = (long)puVar6 - (long)puVar40;
  for (lVar69 = lVar62 >> 5; 0 < lVar69; lVar69 = lVar69 + -1) {
    if ((((puVar40->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t
          .super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type).id == 0x12)
    goto LAB_00922dda;
    if (((puVar40[1]._M_t.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t
          .super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type).id == 0x12) {
      puVar40 = puVar40 + 1;
      goto LAB_00922dda;
    }
    if (((puVar40[2]._M_t.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t
          .super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type).id == 0x12) {
      puVar40 = puVar40 + 2;
      goto LAB_00922dda;
    }
    if (((puVar40[3]._M_t.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t
          .super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type).id == 0x12) {
      puVar40 = puVar40 + 3;
      goto LAB_00922dda;
    }
    puVar40 = puVar40 + 4;
    lVar62 = lVar62 + -0x20;
  }
  lVar62 = lVar62 >> 3;
  if (lVar62 == 1) {
LAB_00922dbc:
    if ((((puVar40->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t
          .super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type).id != 0x12) {
      puVar40 = puVar6;
    }
  }
  else if (lVar62 == 2) {
LAB_00922dae:
    if ((((puVar40->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t
          .super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type).id != 0x12) {
      puVar40 = puVar40 + 1;
      goto LAB_00922dbc;
    }
  }
  else {
    if (lVar62 != 3) goto LAB_009230b2;
    if ((((puVar40->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t
          .super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type).id != 0x12) {
      puVar40 = puVar40 + 1;
      goto LAB_00922dae;
    }
  }
LAB_00922dda:
  if (puVar40 == puVar6) goto LAB_009230b2;
  pTVar58 = (puVar40->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
            _M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
            super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
  *local_170 = pTVar58;
  pcVar7 = *(char **)((long)&(pTVar58->super_Importable).super_Named + 8);
  if (pcVar7 == (char *)0x0) {
    __assert_fail("table.is() && \"Table name must not be null\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-utils.h"
                  ,0x85,
                  "void wasm::ModuleUtils::iterTableSegments(Module &, Name, T) [T = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-splitting.cpp:183:32)]"
                 );
  }
  puVar8 = (primary->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar73 = (primary->elementSegments).
                 super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar73 != puVar8; puVar73 = puVar73 + 1
      ) {
    pEVar9 = (puVar73->_M_t).
             super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
             ._M_t.
             super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
             .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
    if (*(char **)((long)&(pEVar9->table).super_IString + 8) == pcVar7) {
      secondary = (__single_object *)pEVar9;
      std::vector<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>::push_back
                ((vector<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_> *)local_c0
                 ,(value_type *)&secondary);
    }
  }
  ppEVar72 = (this->tableManager).activeTableSegments.
             super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppEVar10 = (this->tableManager).activeTableSegments.
             super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppEVar72 == ppEVar10) {
    secondary = *(__single_object **)
                 &((*local_170)->super_Importable).super_Named.name.super_IString.str;
    pcVar7 = *(char **)((long)&((*local_170)->super_Importable).super_Named.name.super_IString.str +
                       8);
    segmentReferrerCollector.wasm._0_4_ = SUB84(pcVar7,0);
    segmentReferrerCollector.wasm._4_4_ = (undefined4)((ulong)pcVar7 >> 0x20);
    Name::Name((Name *)&segmentReferrerCollector.field_0x8,"");
    segmentReferrerCollector._24_8_ = segmentReferrerCollector._24_8_ & 0xffffffff00000000;
    (pSVar39->tableName).super_IString.str._M_len = (size_t)secondary;
    (this->tableManager).activeBase.tableName.super_IString.str._M_str =
         (char *)CONCAT44(segmentReferrerCollector.wasm._4_4_,segmentReferrerCollector.wasm._0_4_);
    *(undefined4 *)&(this->tableManager).activeBase.global.super_IString.str._M_len =
         segmentReferrerCollector._8_4_;
    *(undefined4 *)((long)&(this->tableManager).activeBase.global.super_IString.str._M_len + 4) =
         segmentReferrerCollector._12_4_;
    *(undefined4 *)&(this->tableManager).activeBase.global.super_IString.str._M_str =
         segmentReferrerCollector._16_4_;
    *(undefined4 *)((long)&(this->tableManager).activeBase.global.super_IString.str._M_str + 4) =
         segmentReferrerCollector._20_4_;
    (this->tableManager).activeBase.index = 0;
  }
  else {
    if (((long)ppEVar10 - (long)ppEVar72 == 8) && (pEVar9 = *ppEVar72, (pEVar9->type).id == 0x12)) {
      IVar2 = pEVar9->offset->_id;
      if (IVar2 == GlobalGetId) {
        (this->tableManager).activeSegment = pEVar9;
        pTVar58 = (this->tableManager).activeTable;
        secondary = (__single_object *)
                    (pTVar58->super_Importable).super_Named.name.super_IString.str._M_len;
        pcVar7 = (pTVar58->super_Importable).super_Named.name.super_IString.str._M_str;
        segmentReferrerCollector.wasm._0_4_ = SUB84(pcVar7,0);
        segmentReferrerCollector.wasm._4_4_ = (undefined4)((ulong)pcVar7 >> 0x20);
        pGVar60 = Expression::cast<wasm::GlobalGet>((*ppEVar72)->offset);
        sVar44 = (pGVar60->name).super_IString.str._M_len;
        pcVar7 = (pGVar60->name).super_IString.str._M_str;
        (pSVar39->tableName).super_IString.str._M_len = (size_t)secondary;
        (this->tableManager).activeBase.tableName.super_IString.str._M_str =
             (char *)CONCAT44(segmentReferrerCollector.wasm._4_4_,
                              segmentReferrerCollector.wasm._0_4_);
        segmentReferrerCollector._8_4_ = SUB84(sVar44,0);
        segmentReferrerCollector._12_4_ = SUB84(sVar44 >> 0x20,0);
        segmentReferrerCollector._16_4_ = SUB84(pcVar7,0);
        segmentReferrerCollector._20_4_ = SUB84((ulong)pcVar7 >> 0x20,0);
        *(undefined4 *)&(this->tableManager).activeBase.global.super_IString.str._M_len =
             segmentReferrerCollector._8_4_;
        *(undefined4 *)((long)&(this->tableManager).activeBase.global.super_IString.str._M_len + 4)
             = segmentReferrerCollector._12_4_;
        *(undefined4 *)&(this->tableManager).activeBase.global.super_IString.str._M_str =
             segmentReferrerCollector._16_4_;
        *(undefined4 *)((long)&(this->tableManager).activeBase.global.super_IString.str._M_str + 4)
             = segmentReferrerCollector._20_4_;
        (this->tableManager).activeBase.index = 0;
        segmentReferrerCollector._8_8_ = sVar44;
        segmentReferrerCollector._16_8_ = pcVar7;
        goto LAB_00922fb0;
      }
      if (IVar2 != ConstId) {
        __assert_fail("activeTableSegments[0]->offset->is<GlobalGet>() && \"Unexpected initializer instruction\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-splitting.cpp"
                      ,199,
                      "wasm::ModuleSplitting::(anonymous namespace)::TableSlotManager::TableSlotManager(Module &)"
                     );
      }
    }
    builder_2.wasm = (Module *)&(this->tableManager).activeBase.global;
    uVar65 = 0;
    for (; ppEVar72 != ppEVar10; ppEVar72 = ppEVar72 + 1) {
      if ((*ppEVar72)->offset->_id != ConstId) {
        __assert_fail("segment->offset->is<Const>() && \"Unexpected non-const segment offset with multiple segments\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-splitting.cpp"
                      ,0xd4,
                      "wasm::ModuleSplitting::(anonymous namespace)::TableSlotManager::TableSlotManager(Module &)"
                     );
      }
      pCVar41 = Expression::cast<wasm::Const>((*ppEVar72)->offset);
      uVar33 = Literal::geti32(&pCVar41->value);
      pEVar9 = *ppEVar72;
      lVar62 = (long)(pEVar9->data).
                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pEVar9->data).
                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3;
      if (uVar65 <= (ulong)uVar33 + lVar62) {
        (this->tableManager).activeSegment = pEVar9;
        pTVar58 = (this->tableManager).activeTable;
        secondary = (__single_object *)
                    (pTVar58->super_Importable).super_Named.name.super_IString.str._M_len;
        pcVar7 = (pTVar58->super_Importable).super_Named.name.super_IString.str._M_str;
        segmentReferrerCollector.wasm._0_4_ = SUB84(pcVar7,0);
        segmentReferrerCollector.wasm._4_4_ = (undefined4)((ulong)pcVar7 >> 0x20);
        Name::Name((Name *)&segmentReferrerCollector.field_0x8,"");
        segmentReferrerCollector._24_4_ = uVar33;
        (pSVar39->tableName).super_IString.str._M_len = (size_t)secondary;
        (this->tableManager).activeBase.tableName.super_IString.str._M_str =
             (char *)CONCAT44(segmentReferrerCollector.wasm._4_4_,
                              segmentReferrerCollector.wasm._0_4_);
        *(undefined4 *)
         &((builder_2.wasm)->exports).
          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = segmentReferrerCollector._8_4_;
        *(undefined4 *)
         ((long)&((builder_2.wasm)->exports).
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 4) = segmentReferrerCollector._12_4_;
        *(undefined4 *)
         &((builder_2.wasm)->exports).
          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = segmentReferrerCollector._16_4_;
        *(undefined4 *)
         ((long)&((builder_2.wasm)->exports).
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 4) = segmentReferrerCollector._20_4_;
        (this->tableManager).activeBase.index = uVar33;
        uVar65 = (ulong)((int)lVar62 + uVar33);
      }
    }
  }
LAB_00922fb0:
  puVar8 = (primary->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar73 = (primary->elementSegments).
                 super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar73 != puVar8; puVar73 = puVar73 + 1
      ) {
    pEVar9 = (puVar73->_M_t).
             super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
             ._M_t.
             super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
             .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
    if (*(char **)((long)&(pEVar9->table).super_IString + 8) != (char *)0x0) {
      Name::Name((Name *)&primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,"");
      pEVar46 = pEVar9->offset;
      iVar34 = 0;
      if (pEVar46->_id == GlobalGetId) {
        primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count = *(size_t *)(pEVar46 + 1);
        segmentReferrers._M_h._M_buckets = (__buckets_ptr)pEVar46[1].type.id;
      }
      else {
        iVar34 = 0;
        if (pEVar46->_id == ConstId) {
          iVar34 = Literal::geti32((Literal *)(pEVar46 + 1));
        }
      }
      uVar33 = 0;
      while( true ) {
        lVar62 = *(long *)&(pEVar9->data).
                           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                           ._M_impl;
        if ((ulong)((long)*(pointer *)
                           ((long)&(pEVar9->data).
                                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                           + 8) - lVar62 >> 3) <= (ulong)uVar33) break;
        pcVar7 = *(char **)(lVar62 + (ulong)uVar33 * 8);
        if (*pcVar7 == '+') {
          secondary = (__single_object *)(pEVar9->table).super_IString.str._M_len;
          pcVar11 = *(char **)((long)&(pEVar9->table).super_IString + 8);
          segmentReferrerCollector.wasm._0_4_ = SUB84(pcVar11,0);
          segmentReferrerCollector.wasm._4_4_ = (undefined4)((ulong)pcVar11 >> 0x20);
          segmentReferrerCollector._8_8_ =
               primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count;
          segmentReferrerCollector._16_8_ = segmentReferrers._M_h._M_buckets;
          segmentReferrerCollector._24_4_ = iVar34 + uVar33;
          in_stack_fffffffffffffd18 = SUB84(secondary,0);
          in_stack_fffffffffffffd1c = (undefined4)((ulong)secondary >> 0x20);
          slot.global.super_IString.str._M_len =
               primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count;
          slot.tableName.super_IString.str = (IString)(IString)(pEVar9->table).super_IString.str;
          slot.global.super_IString.str._M_str = (char *)segmentReferrers._M_h._M_buckets;
          slot.index = iVar34 + uVar33;
          slot._36_4_ = segmentReferrerCollector._28_4_;
          TableSlotManager::addSlot(local_178,(Name)((IString *)(pcVar7 + 0x10))->str,slot);
        }
        uVar33 = uVar33 + 1;
      }
    }
  }
LAB_009230b2:
  (this->minified).state = 0;
  p_Var1 = &(this->exportedPrimaryFuncs)._M_t._M_impl.super__Rb_tree_header;
  (this->exportedPrimaryFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->exportedPrimaryFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->exportedPrimaryFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->exportedPrimaryFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->exportedPrimaryFuncs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_188 = &this->exportedPrimaryFuncs;
  puVar12 = (primary->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar66 = (primary->exports).
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar66 != puVar12;
      puVar66 = puVar66 + 1) {
    pEVar38 = (puVar66->_M_t).
              super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
              super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
    if (pEVar38->kind == Function) {
      if (*(__index_type *)
           ((long)&(pEVar38->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 0x10) == '\0')
      {
        pvVar63 = &pEVar38->value;
      }
      else {
        pvVar63 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
      }
      pmVar42 = std::
                map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                ::operator[](local_188,(key_type *)pvVar63);
      uVar26 = *(undefined4 *)((long)&(pEVar38->name).super_IString + 4);
      uVar27 = *(undefined4 *)((long)&(pEVar38->name).super_IString + 8);
      uVar28 = *(undefined4 *)((long)&(pEVar38->name).super_IString + 0xc);
      *(undefined4 *)&(pmVar42->super_IString).str._M_len =
           *(undefined4 *)&(pEVar38->name).super_IString;
      *(undefined4 *)((long)&(pmVar42->super_IString).str._M_len + 4) = uVar26;
      *(undefined4 *)&(pmVar42->super_IString).str._M_str = uVar27;
      *(undefined4 *)((long)&(pmVar42->super_IString).str._M_str + 4) = uVar28;
    }
  }
  p_Var1 = &(this->placeholderMap)._M_t._M_impl.super__Rb_tree_header;
  (this->placeholderMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->placeholderMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->placeholderMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->placeholderMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->internalLoadSecondaryModule).super_IString.str._M_str = (char *)0x0;
  (this->placeholderMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->internalLoadSecondaryModule).super_IString.str._M_len = 0;
  if (config->jspi == true) {
    name_04.super_IString.str._M_str = (char *)DAT_01174998.id;
    name_04.super_IString.str._M_len = (size_t)LOAD_SECONDARY_MODULE;
    pEVar38 = Module::getExportOrNull(this->primary,name_04);
    HVar14.id = DAT_01174998.id;
    pcVar7 = LOAD_SECONDARY_MODULE;
    if ((pEVar38 == (Export *)0x0) || (pEVar38->kind != Function)) {
      HeapType::HeapType((HeapType *)auStack_b8,(Signature)ZEXT816(0));
      secondary = (__single_object *)0x0;
      segmentReferrerCollector.wasm._0_4_ = 0;
      segmentReferrerCollector.wasm._4_4_ = 0;
      segmentReferrerCollector._8_8_ = 0;
      name_00.super_IString.str._M_str = pcVar7;
      name_00.super_IString.str._M_len =
           (size_t)&primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count;
      Builder::makeFunction
                (name_00,HVar14,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_b8,
                 (Expression *)&secondary);
      std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)&secondary);
      *(undefined8 *)(primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x18) = ENV;
      *(undefined8 *)(primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x20) =
           DAT_01174c48;
      *(char **)(primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x28) =
           LOAD_SECONDARY_MODULE;
      *(uintptr_t *)(primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x30) =
           DAT_01174998.id;
      Module::addFunction(this->primary,
                          (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                          &primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count);
      pcVar7 = (char *)DAT_01174998.id;
      (this->internalLoadSecondaryModule).super_IString.str._M_len = (size_t)LOAD_SECONDARY_MODULE;
      (this->internalLoadSecondaryModule).super_IString.str._M_str = pcVar7;
      std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
                ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                 &primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    else {
      pvVar63 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
      if (*(__index_type *)
           ((long)&(pEVar38->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
                   super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                   super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                   super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                   super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                   super__Variant_storage_alias<wasm::Name,_wasm::HeapType> + 0x10) == '\0') {
        pvVar63 = &pEVar38->value;
      }
      pcVar7 = *(char **)((long)&(pvVar63->super__Variant_base<wasm::Name,_wasm::HeapType>).
                                 super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                                 super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                                 super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                                 super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                                 super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u + 8);
      (this->internalLoadSecondaryModule).super_IString.str._M_len =
           *(size_t *)
            &(pvVar63->super__Variant_base<wasm::Name,_wasm::HeapType>).
             super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
             super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
             super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
             super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
             super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u;
      (this->internalLoadSecondaryModule).super_IString.str._M_str = pcVar7;
      name_05.super_IString.str._M_str = (char *)DAT_01174998.id;
      name_05.super_IString.str._M_len = (size_t)LOAD_SECONDARY_MODULE;
      Module::removeExport(this->primary,name_05);
    }
    TVar49.id = DAT_011749a8.id;
    p_Var30 = ModuleSplitting::(anonymous_namespace)::LOAD_SECONDARY_STATUS;
    pMVar56 = this->primary;
    auStack_128 = (undefined1  [8])pMVar56;
    pCVar41 = Builder::makeConst<int>((Builder *)auStack_128,0);
    name_01.super_IString.str._M_str = (char *)p_Var30;
    name_01.super_IString.str._M_len = (size_t)&secondary;
    Builder::makeGlobal(name_01,TVar49,(Expression *)0x2,(Mutability)pCVar41);
    Module::addGlobal(pMVar56,(unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
                              &secondary);
    std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr
              ((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)&secondary);
    pMVar56 = this->primary;
    secondary = ModuleSplitting::(anonymous_namespace)::LOAD_SECONDARY_STATUS;
    segmentReferrerCollector.wasm._0_4_ = (undefined4)DAT_011749a8.id;
    segmentReferrerCollector.wasm._4_4_ = (undefined4)(DAT_011749a8.id >> 0x20);
    segmentReferrerCollector._8_8_ = segmentReferrerCollector._8_8_ & 0xffffffffffffff00;
    primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)ModuleSplitting::(anonymous_namespace)::LOAD_SECONDARY_STATUS;
    segmentReferrers._M_h._M_buckets = (__buckets_ptr)DAT_011749a8.id;
    auStack_168._0_4_ = 3;
    std::
    make_unique<wasm::Export,wasm::Name&,wasm::ExternalKind&,std::variant<wasm::Name,wasm::HeapType>&>
              ((Name *)auStack_148,
               (ExternalKind *)&primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (variant<wasm::Name,_wasm::HeapType> *)auStack_168);
    Module::addExport(pMVar56,(unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
                              auStack_148);
    std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr
              ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)auStack_148);
  }
  psVar13 = this->secondaryFuncs;
  for (p_Var35 = (psVar13->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var35 != &(psVar13->_M_t)._M_impl.super__Rb_tree_header;
      p_Var35 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var35)) {
    IVar82.str = *(string_view *)(p_Var35 + 1);
    pFVar43 = Module::getFunction(this->primary,(Name)*(string_view *)(p_Var35 + 1));
    segmentReferrerCollector._16_8_ = segmentReferrerCollector._16_8_ & 0xffffffffffffff00;
    segmentReferrers._M_h._M_before_begin._M_nxt =
         segmentReferrers._M_h._M_before_begin._M_nxt & 0xffffffffffffff00;
    psVar70 = &primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count;
    auVar25._8_8_ = 0;
    auVar25._0_8_ =
         (_Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
         &secondary;
    wasm::ModuleUtils::copyFunction
              ((ModuleUtils *)pFVar43,(Function *)this->secondary,(Module *)0x0,
               (Name)(auVar25 << 0x40),
               (optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)psVar70,
               (optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
    std::_Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::_M_reset
              ((_Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               psVar70);
    std::_Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::_M_reset
              ((_Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &secondary);
    Module::removeFunction(this->primary,(Name)IVar82.str);
  }
  auStack_b8 = (undefined1  [8])this->primary;
  BVar67.wasm = (Module *)
                (((Module *)auStack_b8)->exports).
                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  psVar70 = &primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count;
  builder_2.wasm = BVar67.wasm;
  for (pMVar56 = (Module *)
                 (((Module *)auStack_b8)->exports).
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pMVar56 != BVar67.wasm;
      pMVar56 = (Module *)
                &(pMVar56->exports).
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
    p_Var74 = (_List_node_base *)
              (pMVar56->exports).
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (*(int *)&p_Var74[1]._M_next == 0) {
      __x = &p_Var74[1]._M_prev;
      if (*(char *)&p_Var74[2]._M_prev != '\0') {
        __x = (_List_node_base **)0x0;
      }
      sVar36 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::count
                         (this->secondaryFuncs,(key_type *)__x);
      if (sVar36 != 0) {
        p_Var74 = (_List_node_base *)
                  (pMVar56->exports).
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar61 = (string_view *)&p_Var74[1]._M_prev;
        if (*(char *)&p_Var74[2]._M_prev != '\0') {
          psVar61 = (string_view *)0x0;
        }
        pcVar7 = (char *)psVar61->_M_len;
        HVar14.id = (uintptr_t)psVar61->_M_str;
        func = *psVar61;
        name = *psVar61;
        pFVar43 = Module::getFunctionOrNull(this->primary,(Name)*psVar61);
        if (pFVar43 == (Function *)0x0) {
          pMVar15 = this->primary;
          pFVar43 = Module::getFunction(this->secondary,(Name)name);
          secondary = (__single_object *)0x0;
          segmentReferrerCollector.wasm._0_4_ = 0;
          segmentReferrerCollector.wasm._4_4_ = 0;
          segmentReferrerCollector._8_8_ = 0;
          name_02.super_IString.str._M_str = pcVar7;
          name_02.super_IString.str._M_len = (size_t)psVar70;
          Builder::makeFunction
                    (name_02,HVar14,
                     (vector<wasm::Type,_std::allocator<wasm::Type>_> *)(pFVar43->type).id,
                     (Expression *)&secondary);
          pFVar43 = Module::addFunction(pMVar15,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                                 *)psVar70);
          std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
                    ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)psVar70);
          std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                    ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)&secondary);
          primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          segmentReferrers._M_h._M_buckets = (__buckets_ptr)0x0;
          segmentReferrers._M_h._M_bucket_count = 0;
          local_c0 = (Module *)&pFVar43->type;
          SVar80 = HeapType::getSignature((HeapType *)local_c0);
          auStack_128 = (undefined1  [8])SVar80.params.id;
          sVar44 = wasm::Type::size((Type *)auStack_128);
          for (i_00 = 0; sVar44 != i_00; i_00 = i_00 + 1) {
            pTVar45 = wasm::Type::operator[]((Type *)auStack_128,i_00);
            uVar16 = pTVar45->id;
            secondary = (__single_object *)
                        MixedArena::alloc<wasm::LocalGet>((MixedArena *)((long)auStack_b8 + 0x200));
            ((LocalGet *)secondary)->index = (Index)i_00;
            (((LocalGet *)secondary)->super_SpecificExpression<(wasm::Expression::Id)8>).
            super_Expression.type.id = uVar16;
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            emplace_back<wasm::Expression*>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)psVar70,
                       (Expression **)&secondary);
          }
          TableSlotManager::getSlot
                    ((Slot *)&secondary,local_178,(Name)func,
                     (HeapType)
                     (((_Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                        *)&local_c0->exports)->_M_impl).super__Vector_impl_data._M_start);
          table.super_IString.str._M_str._0_4_ = segmentReferrerCollector.wasm._0_4_;
          table.super_IString.str._M_len = (size_t)secondary;
          table.super_IString.str._M_str._4_4_ = segmentReferrerCollector.wasm._4_4_;
          pEVar46 = TableSlotManager::Slot::makeExpr((Slot *)&secondary,this->primary);
          pCVar47 = Builder::
                    makeCallIndirect<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                              ((Builder *)auStack_b8,table,pEVar46,
                               (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                               psVar70,(HeapType)
                                       (((_Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                                          *)&local_c0->exports)->_M_impl).super__Vector_impl_data.
                                       _M_start,false);
          pFVar43->body = (Expression *)pCVar47;
          std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
                    ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                     psVar70);
          BVar67 = builder_2;
        }
      }
    }
  }
  secondary = (__single_object *)0x0;
  segmentReferrerCollector.wasm._0_4_ = 0;
  segmentReferrerCollector.wasm._4_4_ = 0;
  local_1a0._M_next = &local_1a0;
  local_190 = 0;
  pMVar56 = this->primary;
  puVar17 = (pMVar56->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_1a0._M_prev = local_1a0._M_next;
  for (puVar77 = (pMVar56->globals).
                 super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar77 != puVar17;
      puVar77 = puVar77 + 1) {
    pGVar18 = (puVar77->_M_t).
              super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
              super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
    if (*(char **)((long)&(pGVar18->super_Importable).module + 8) == (char *)0x0) {
      Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_>::walk
                ((Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_> *)&secondary,&pGVar18->init);
    }
  }
  puVar4 = (pMVar56->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar71 = (pMVar56->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar71 != puVar4; puVar71 = puVar71 + 1
      ) {
    pFVar43 = (puVar71->_M_t).
              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    if (*(char **)((long)&(pFVar43->super_Importable).module + 8) == (char *)0x0) {
      Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_>::walk
                ((Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_> *)&secondary,&pFVar43->body);
    }
  }
  puVar8 = (pMVar56->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar73 = (pMVar56->elementSegments).
                 super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar73 != puVar8; puVar73 = puVar73 + 1
      ) {
    pEVar9 = (puVar73->_M_t).
             super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
             ._M_t.
             super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
             .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
    if (*(char **)((long)&(pEVar9->table).super_IString + 8) != (char *)0x0) {
      Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_>::walk
                ((Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_> *)&secondary,&pEVar9->offset);
    }
    ppEVar19 = *(pointer *)
                ((long)&(pEVar9->data).
                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                + 8);
    for (ppEVar79 = *(pointer *)
                     &(pEVar9->data).
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl; ppEVar79 != ppEVar19; ppEVar79 = ppEVar79 + 1) {
      primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)*ppEVar79;
      Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_>::walk
                ((Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_> *)&secondary,
                 (Expression **)&primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
  }
  puVar20 = (pMVar56->dataSegments).
            super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar76 = (pMVar56->dataSegments).
                 super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar76 != puVar20;
      puVar76 = puVar76 + 1) {
    pDVar21 = (puVar76->_M_t).
              super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t
              .super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
              super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
    if (pDVar21->isPassive == false) {
      Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_>::walk
                ((Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_> *)&secondary,&pDVar21->offset);
    }
  }
  primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)&segmentReferrers._M_h._M_rehash_policy._M_next_resize;
  segmentReferrers._M_h._M_buckets = (__buckets_ptr)0x1;
  segmentReferrers._M_h._M_bucket_count = 0;
  segmentReferrers._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  segmentReferrers._M_h._M_element_count =
       CONCAT44(segmentReferrers._M_h._M_element_count._4_4_,0x3f800000);
  segmentReferrers._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  segmentReferrers._M_h._M_rehash_policy._4_4_ = 0;
  segmentReferrers._M_h._M_rehash_policy._M_next_resize = 0;
  pEVar9 = (this->tableManager).activeSegment;
  if (pEVar9 != (ElementSegment *)0x0) {
    ppEVar19 = (pEVar9->data).
               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    for (ppEVar79 = (pEVar9->data).
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppEVar79 != ppEVar19;
        ppEVar79 = ppEVar79 + 1) {
      auStack_b8 = (undefined1  [8])*ppEVar79;
      if (*(char *)&(((Module *)auStack_b8)->exports).
                    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != '+') {
        auStack_b8 = (undefined1  [8])0x0;
      }
      if (auStack_b8 != (undefined1  [8])0x0) {
        std::__detail::
        _Insert_base<wasm::RefFunc_*,_wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>,_std::__detail::_Identity,_std::equal_to<wasm::RefFunc_*>,_std::hash<wasm::RefFunc_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::insert((_Insert_base<wasm::RefFunc_*,_wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>,_std::__detail::_Identity,_std::equal_to<wasm::RefFunc_*>,_std::hash<wasm::RefFunc_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)&primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (value_type *)auStack_b8);
      }
    }
  }
  local_f0.wasm = this->primary;
  for (p_Var74 = local_1a0._M_next; p_Var74 != &local_1a0; p_Var74 = p_Var74->_M_next) {
    relevantRefFuncs.super__Vector_base<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_168 = (undefined1  [8])0x0;
    relevantRefFuncs.super__Vector_base<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    p_Var22 = p_Var74[2]._M_prev;
    for (p_Var68 = p_Var74[2]._M_next; p_Var68 != p_Var22;
        p_Var68 = (_List_node_base *)&p_Var68->_M_prev) {
      auStack_b8 = (undefined1  [8])p_Var68->_M_next;
      if ((_List_node_base *)
          (((Module *)auStack_b8)->functions).
          super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != p_Var74[1]._M_prev) {
        __assert_fail("refFunc->func == name",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-splitting.cpp"
                      ,0x261,
                      "void wasm::ModuleSplitting::(anonymous namespace)::ModuleSplitter::indirectReferencesToSecondaryFunctions()"
                     );
      }
      sVar48 = std::
               _Hashtable<wasm::RefFunc_*,_wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>,_std::__detail::_Identity,_std::equal_to<wasm::RefFunc_*>,_std::hash<wasm::RefFunc_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::count((_Hashtable<wasm::RefFunc_*,_wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>,_std::__detail::_Identity,_std::equal_to<wasm::RefFunc_*>,_std::hash<wasm::RefFunc_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)&primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (key_type *)auStack_b8);
      if (sVar48 == 0) {
        std::vector<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>::push_back
                  ((vector<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_> *)auStack_168,
                   (value_type *)auStack_b8);
      }
    }
    if (auStack_168 !=
        (undefined1  [8])
        relevantRefFuncs.super__Vector_base<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      pFVar43 = Module::getFunction(this->secondary,(Name)p_Var74[1]);
      pMVar56 = this->primary;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)auStack_128,"trampoline_",
                 (allocator<char> *)((long)&segmentReferrers._M_h._M_single_bucket + 7));
      IString::toString_abi_cxx11_((string *)auStack_148,(IString *)(p_Var74 + 1));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_b8
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      auStack_128,(string *)auStack_148);
      IString::IString((IString *)local_d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_b8);
      root_00.super_IString.str._M_len._4_4_ = local_d0._4_4_;
      root_00.super_IString.str._M_len._0_4_ = local_d0._0_4_;
      root_00.super_IString.str._M_str = _currBase;
      NVar81 = Names::getValidFunctionName(pMVar56,root_00);
      std::__cxx11::string::~string((string *)auStack_b8);
      std::__cxx11::string::~string((string *)auStack_148);
      std::__cxx11::string::~string((string *)auStack_128);
      auStack_b8 = (undefined1  [8])0x0;
      primaryFuncs._M_t._M_impl._0_4_ = 0;
      primaryFuncs._M_t._M_impl._4_4_ = 0;
      primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      uVar65 = 0;
      while( true ) {
        local_48.id = NVar81.super_IString.str._M_str;
        local_40 = NVar81.super_IString.str._M_len;
        sVar44 = Function::getNumParams(pFVar43);
        index = (Index)uVar65;
        if (sVar44 <= uVar65) break;
        TVar49 = Function::getLocalType(pFVar43,index);
        auStack_128 = (undefined1  [8])
                      MixedArena::alloc<wasm::LocalGet>(&(local_f0.wasm)->allocator);
        *(Index *)&(((Module *)auStack_128)->exports).
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage = index;
        (((Module *)auStack_128)->exports).
        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)TVar49.id;
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        emplace_back<wasm::Expression*>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_b8,
                   (Expression **)auStack_128);
        uVar65 = (ulong)(index + 1);
      }
      target = p_Var74[1];
      SVar80 = HeapType::getSignature(&pFVar43->type);
      Builder::makeCall(&local_f0,(Name)target,
                        (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                        auStack_b8,SVar80.results.id,false);
      pMVar56 = this->primary;
      auStack_128 = (undefined1  [8])0x0;
      builder.wasm = (Module *)0x0;
      name_03.super_IString.str._M_str = local_40;
      name_03.super_IString.str._M_len = (size_t)auStack_148;
      Builder::makeFunction
                (name_03,local_48,
                 (vector<wasm::Type,_std::allocator<wasm::Type>_> *)(pFVar43->type).id,
                 (Expression *)auStack_128);
      Module::addFunction(pMVar56,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                   *)auStack_148);
      std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
                ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)auStack_148);
      std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_128);
      for (auVar50 = auStack_168;
          auVar50 !=
          (undefined1  [8])
          relevantRefFuncs.super__Vector_base<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>.
          _M_impl.super__Vector_impl_data._M_start;
          auVar50 = (undefined1  [8])
                    &(((Module *)auVar50)->exports).
                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) {
        *(IString *)
         &(((Module *)auVar50)->exports).
          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[2]._M_t = NVar81.super_IString.str;
      }
      std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
                ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_b8
                );
    }
    std::_Vector_base<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>::~_Vector_base
              ((_Vector_base<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_> *)auStack_168);
  }
  std::
  _Hashtable<wasm::RefFunc_*,_wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>,_std::__detail::_Identity,_std::equal_to<wasm::RefFunc_*>,_std::hash<wasm::RefFunc_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::RefFunc_*,_wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>,_std::__detail::_Identity,_std::equal_to<wasm::RefFunc_*>,_std::hash<wasm::RefFunc_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ::anon_func::Gatherer::~Gatherer((Gatherer *)&secondary);
  secondary = (__single_object *)0x0;
  segmentReferrerCollector.wasm._0_4_ = 0;
  segmentReferrerCollector.wasm._4_4_ = 0;
  pMVar56 = this->primary;
  puVar17 = (pMVar56->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar77 = (pMVar56->globals).
                 super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar77 != puVar17;
      puVar77 = puVar77 + 1) {
    pGVar18 = (puVar77->_M_t).
              super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
              super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
    if (*(char **)((long)&(pGVar18->super_Importable).module + 8) == (char *)0x0) {
      Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::walk
                ((Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_> *)&secondary,
                 &pGVar18->init);
    }
  }
  puVar4 = (pMVar56->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar71 = (pMVar56->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar71 != puVar4; puVar71 = puVar71 + 1
      ) {
    pFVar43 = (puVar71->_M_t).
              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    if (*(char **)((long)&(pFVar43->super_Importable).module + 8) == (char *)0x0) {
      Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::walk
                ((Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_> *)&secondary,
                 &pFVar43->body);
    }
  }
  puVar20 = (pMVar56->dataSegments).
            super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar76 = (pMVar56->dataSegments).
                 super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar76 != puVar20;
      puVar76 = puVar76 + 1) {
    pDVar21 = (puVar76->_M_t).
              super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t
              .super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
              super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
    if (pDVar21->isPassive == false) {
      Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::walk
                ((Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_> *)&secondary,
                 &pDVar21->offset);
    }
  }
  Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::~Walker
            ((Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_> *)&secondary);
  primaryFuncs._M_t._M_impl._0_4_ = 0;
  primaryFuncs._M_t._M_impl._4_4_ = 0;
  primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       std::
       _Function_handler<void_(wasm::Function_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-splitting.cpp:670:16)>
       ::_M_invoke;
  primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       std::
       _Function_handler<void_(wasm::Function_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-splitting.cpp:670:16)>
       ::_M_manager;
  auStack_b8 = (undefined1  [8])this;
  wasm::ModuleUtils::
  ParallelFunctionAnalysis<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  ::ParallelFunctionAnalysis
            ((ParallelFunctionAnalysis<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
              *)&secondary,this->secondary,(Func *)auStack_b8);
  std::_Function_base::~_Function_base((_Function_base *)auStack_b8);
  segmentReferrers._M_h._M_before_begin._M_nxt = (_Hash_node_base *)&segmentReferrers;
  segmentReferrers._M_h._M_buckets =
       (__buckets_ptr)((ulong)segmentReferrers._M_h._M_buckets & 0xffffffff00000000);
  segmentReferrers._M_h._M_bucket_count = 0;
  segmentReferrers._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  segmentReferrers._M_h._M_rehash_policy._4_4_ = 0;
  segmentReferrers._M_h._M_element_count = (size_type)segmentReferrers._M_h._M_before_begin._M_nxt;
  for (p_Var35 = (_Rb_tree_node_base *)segmentReferrerCollector._24_8_;
      _Var51._M_nxt = segmentReferrers._M_h._M_before_begin._M_nxt,
      p_Var35 != (_Rb_tree_node_base *)&segmentReferrerCollector.field_0x8;
      p_Var35 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var35)) {
    std::
    _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
    ::
    _M_insert_range_unique<__gnu_cxx::__normal_iterator<wasm::Name*,std::vector<wasm::Name,std::allocator<wasm::Name>>>>
              ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                *)&primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (Name *)p_Var35[1]._M_parent,(Name *)p_Var35[1]._M_left);
  }
  for (; (_Rb_tree_node_base *)_Var51._M_nxt != (_Rb_tree_node_base *)&segmentReferrers;
      _Var51._M_nxt = (_Hash_node_base *)std::_Rb_tree_increment(_Var51._M_nxt)) {
    exportImportFunction(this,(Name)*(string_view *)((long)_Var51._M_nxt + 0x20));
  }
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
               *)&segmentReferrerCollector);
  if (*local_170 != (Table *)0x0) {
    segmentReferrerCollector.wasm._0_4_ = 0;
    segmentReferrerCollector._8_8_ = 0;
    segmentReferrerCollector._32_8_ = 0;
    pMVar56 = (Module *)
              (this->primary->elementSegments).
              super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    builder_2.wasm =
         (Module *)
         (this->primary->elementSegments).
         super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    segmentReferrerCollector._16_8_ = &segmentReferrerCollector;
    segmentReferrerCollector._24_8_ = &segmentReferrerCollector;
    while( true ) {
      if (pMVar56 == builder_2.wasm) break;
      ppEVar72 = (((_Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_> *)
                  &pMVar56->exports)->_M_impl).super__Vector_impl_data._M_start;
      if (ppEVar72[4] != (ElementSegment *)0x0) {
        Name::Name((Name *)auStack_168,"");
        pEVar9 = ppEVar72[5];
        cVar3 = *(char *)&(pEVar9->super_Named).name.super_IString;
        iVar34 = 0;
        if (cVar3 == '\n') {
          auStack_168 = *(undefined1 (*) [8])&(pEVar9->super_Named).hasExplicitName;
          relevantRefFuncs.super__Vector_base<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)(pEVar9->table).super_IString.str._M_len;
        }
        else if (cVar3 == '\x0e') {
          iVar34 = Literal::geti32((Literal *)&(pEVar9->super_Named).hasExplicitName);
        }
        uVar33 = 0;
        local_c0 = pMVar56;
        while( true ) {
          uVar65 = (ulong)uVar33;
          pEVar9 = ppEVar72[7];
          pMVar56 = local_c0;
          if ((ulong)((long)ppEVar72[8] - (long)pEVar9 >> 3) <= uVar65) break;
          local_f0.wasm._0_4_ = iVar34 + uVar33;
          pcVar7 = *(char **)((long)&(pEVar9->super_Named).name.super_IString + uVar65 * 8);
          if (*pcVar7 == '+') {
            sVar36 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::count
                               (this->secondaryFuncs,(key_type *)(pcVar7 + 0x10));
            if (sVar36 != 0) {
              primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count =
                   (size_t)(iVar34 + uVar33);
              pmVar52 = std::
                        map<unsigned_long,_wasm::Name,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
                        ::operator[](&this->placeholderMap,
                                     &primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count)
              ;
              pcVar11 = *(char **)(pcVar7 + 0x18);
              (pmVar52->super_IString).str._M_len =
                   (((key_type *)(pcVar7 + 0x10))->super_IString).str._M_len;
              (pmVar52->super_IString).str._M_str = pcVar11;
              pFVar43 = Module::getFunction(this->secondary,(Name)((IString *)(pcVar7 + 0x10))->str)
              ;
              ppFVar53 = std::
                         map<unsigned_int,_wasm::Function_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Function_*>_>_>
                         ::operator[]((map<unsigned_int,_wasm::Function_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Function_*>_>_>
                                       *)&secondary,(key_type *)&local_f0);
              *ppFVar53 = pFVar43;
              if (this->config->usePlaceholders == false) {
                primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count =
                     (size_t)this->primary;
                pRVar55 = Builder::makeRefNull
                                    ((Builder *)
                                     &primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                     (HeapType)0x68);
                *(RefNull **)((long)&(pEVar9->super_Named).name.super_IString + uVar65 * 8) =
                     pRVar55;
              }
              else {
                std::make_unique<wasm::Function>();
                pcVar7 = (this->config->placeholderNamespace).super_IString.str._M_str;
                *(size_t *)(CONCAT44(local_d0._4_4_,local_d0._0_4_) + 0x18) =
                     (this->config->placeholderNamespace).super_IString.str._M_len;
                *(char **)(CONCAT44(local_d0._4_4_,local_d0._0_4_) + 0x20) = pcVar7;
                psVar70 = &primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count;
                std::__cxx11::to_string((string *)psVar70,(uint)local_f0.wasm);
                IString::IString((IString *)auStack_b8,(string *)psVar70);
                *(undefined1 (*) [8])(CONCAT44(local_d0._4_4_,local_d0._0_4_) + 0x28) = auStack_b8;
                *(ulong *)(CONCAT44(local_d0._4_4_,local_d0._0_4_) + 0x30) =
                     CONCAT44(primaryFuncs._M_t._M_impl._4_4_,primaryFuncs._M_t._M_impl._0_4_);
                std::__cxx11::string::~string((string *)psVar70);
                pMVar56 = this->primary;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)auStack_b8,"placeholder_",
                           (allocator<char> *)((long)&segmentReferrers._M_h._M_single_bucket + 7));
                IString::toString_abi_cxx11_
                          ((string *)auStack_128,
                           (IString *)(CONCAT44(local_d0._4_4_,local_d0._0_4_) + 0x28));
                psVar70 = &primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count;
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               psVar70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)auStack_b8,(string *)auStack_128);
                IString::IString((IString *)auStack_148,(string *)psVar70);
                root.super_IString.str._M_str =
                     (char *)secondarySeg._M_t.
                             super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                             .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
                root.super_IString.str._M_len = (size_t)auStack_148;
                IVar82.str = (string_view)Names::getValidFunctionName(pMVar56,root);
                ((IString *)CONCAT44(local_d0._4_4_,local_d0._0_4_))->str = IVar82.str;
                psVar70 = &primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count;
                std::__cxx11::string::~string((string *)psVar70);
                std::__cxx11::string::~string((string *)auStack_128);
                std::__cxx11::string::~string((string *)auStack_b8);
                pIVar29 = (IString *)CONCAT44(local_d0._4_4_,local_d0._0_4_);
                *(undefined1 *)&pIVar29[1].str = 1;
                HVar14.id = (pFVar43->type).id;
                *(uintptr_t *)((long)(pIVar29 + 3) + 8) = HVar14.id;
                primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count =
                     (size_t)this->primary;
                pRVar54 = Builder::makeRefFunc((Builder *)psVar70,(Name)pIVar29->str,HVar14);
                *(RefFunc **)((long)&(pEVar9->super_Named).name.super_IString + uVar65 * 8) =
                     pRVar54;
                Module::addFunction(this->primary,
                                    (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                     *)local_d0);
                std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
                          ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                           local_d0);
              }
            }
          }
          uVar33 = uVar33 + 1;
        }
      }
      pMVar56 = (Module *)
                &(((_Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_> *)
                  &pMVar56->exports)->_M_impl).super__Vector_impl_data._M_finish;
    }
    if (segmentReferrerCollector._32_8_ != 0) {
      pMVar56 = (Module *)
                wasm::ModuleUtils::copyTable((this->tableManager).activeTable,this->secondary);
      auStack_128 = (undefined1  [8])pMVar56;
      if ((this->tableManager).activeBase.global.super_IString.str._M_len == 0) {
        local_d0._0_4_ = *(_Rb_tree_color *)(segmentReferrerCollector._16_8_ + 0x20);
        primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        auStack_b8 = (undefined1  [8])0x0;
        primaryFuncs._M_t._M_impl._0_4_ = 0;
        primaryFuncs._M_t._M_impl._4_4_ = 0;
        primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
        segmentReferrers._M_h._M_buckets = (__buckets_ptr)local_d0;
        segmentReferrers._M_h._M_bucket_count = (size_type)auStack_128;
        segmentReferrers._M_h._M_before_begin._M_nxt = (_Hash_node_base *)auStack_b8;
        for (p_Var35 = (_Rb_tree_node_base *)segmentReferrerCollector._16_8_;
            p_Var35 != (_Rb_tree_node_base *)&segmentReferrerCollector;
            p_Var35 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var35)) {
          if ((CONCAT44(primaryFuncs._M_t._M_impl._4_4_,primaryFuncs._M_t._M_impl._0_4_) -
               (long)auStack_b8 >> 3) + (ulong)(uint)local_d0._0_4_ != (ulong)p_Var35[1]._M_color) {
            setupTablePatching::anon_class_32_4_bf007958::operator()
                      ((anon_class_32_4_bf007958 *)
                       &primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count);
            local_d0._0_4_ = p_Var35[1]._M_color;
            if ((undefined1  [8])
                CONCAT44(primaryFuncs._M_t._M_impl._4_4_,primaryFuncs._M_t._M_impl._0_4_) !=
                auStack_b8) {
              primaryFuncs._M_t._M_impl._0_4_ = auStack_b8._0_4_;
              primaryFuncs._M_t._M_impl._4_4_ = auStack_b8._4_4_;
            }
          }
          auStack_168 = (undefined1  [8])this->secondary;
          auStack_148 = (undefined1  [8])
                        Builder::makeRefFunc
                                  ((Builder *)auStack_168,(Name)*(string_view *)p_Var35[1]._M_parent
                                   ,(HeapType)p_Var35[1]._M_parent[1]._M_right);
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_b8,
                     (Expression **)auStack_148);
        }
        if ((undefined1  [8])
            CONCAT44(primaryFuncs._M_t._M_impl._4_4_,primaryFuncs._M_t._M_impl._0_4_) != auStack_b8)
        {
          setupTablePatching::anon_class_32_4_bf007958::operator()
                    ((anon_class_32_4_bf007958 *)
                     &primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count);
        }
        psVar70 = (size_t *)auStack_b8;
      }
      else {
        ppEVar72 = (this->tableManager).activeTableSegments.
                   super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        if ((long)(this->tableManager).activeTableSegments.
                  super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar72 != 8) {
          __assert_fail("tableManager.activeTableSegments.size() == 1 && \"Unexpected number of segments with non-const base\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-splitting.cpp"
                        ,0x2ee,
                        "void wasm::ModuleSplitting::(anonymous namespace)::ModuleSplitter::setupTablePatching()"
                       );
        }
        pMVar15 = this->secondary;
        if (((long)(pMVar15->tables).
                   super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pMVar15->tables).
                   super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start != 8) ||
           ((pMVar15->elementSegments).
            super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pMVar15->elementSegments).
            super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          __assert_fail("secondary.tables.size() == 1 && secondary.elementSegments.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-splitting.cpp"
                        ,0x2ef,
                        "void wasm::ModuleSplitting::(anonymous namespace)::ModuleSplitter::setupTablePatching()"
                       );
        }
        pEVar9 = *ppEVar72;
        primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        segmentReferrers._M_h._M_buckets = (__buckets_ptr)0x0;
        segmentReferrers._M_h._M_bucket_count = 0;
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::reserve
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                   &primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (long)*(pointer *)
                          ((long)&(pEVar9->data).
                                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                  ._M_impl + 8) -
                   *(long *)&(pEVar9->data).
                             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                             ._M_impl.super__Vector_impl_data >> 3);
        _Var64 = _S_red;
        psVar70 = &primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count;
        p_Var35 = (_Rb_tree_node_base *)segmentReferrerCollector._16_8_;
        while( true ) {
          uVar65 = (ulong)_Var64;
          lVar62 = *(long *)&(pEVar9->data).
                             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                             ._M_impl.super__Vector_impl_data;
          if (((ulong)((long)*(pointer *)
                              ((long)&(pEVar9->data).
                                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                      ._M_impl + 8) - lVar62 >> 3) <= uVar65) ||
             (p_Var35 == (_Rb_tree_node_base *)&segmentReferrerCollector)) break;
          if (_Var64 == p_Var35[1]._M_color) {
            auStack_b8 = (undefined1  [8])this->secondary;
            auStack_b8 = (undefined1  [8])
                         Builder::makeRefFunc
                                   ((Builder *)auStack_b8,(Name)*(string_view *)p_Var35[1]._M_parent
                                    ,(HeapType)p_Var35[1]._M_parent[1]._M_right);
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            emplace_back<wasm::Expression*>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)psVar70,
                       (Expression **)auStack_b8);
            p_Var35 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var35);
          }
          else {
            pcVar7 = *(char **)(lVar62 + uVar65 * 8);
            if (*pcVar7 == '+') {
              exportImportFunction(this,(Name)((IString *)(pcVar7 + 0x10))->str);
              iVar34 = ExpressionManipulator::copy
                                 (*(EVP_PKEY_CTX **)
                                   (*(long *)&(pEVar9->data).
                                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                              ._M_impl.super__Vector_impl_data + uVar65 * 8),
                                  (EVP_PKEY_CTX *)this->secondary);
              auStack_b8 = (undefined1  [8])CONCAT44(extraout_var,iVar34);
              std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                        ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)psVar70,
                         (value_type *)auStack_b8);
            }
          }
          _Var64 = _Var64 + _S_black;
        }
        iVar34 = ExpressionManipulator::copy
                           ((EVP_PKEY_CTX *)pEVar9->offset,(EVP_PKEY_CTX *)this->secondary);
        auStack_b8 = (undefined1  [8])CONCAT44(extraout_var_00,iVar34);
        std::
        make_unique<wasm::ElementSegment,wasm::Name&,wasm::Expression*&,wasm::Type&,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>&>
                  ((Name *)auStack_148,(Expression **)pMVar56,(Type *)auStack_b8,
                   (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                   &(pMVar56->tags).
                    super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        pcVar7 = *(char **)((long)&(pEVar9->super_Named).name.super_IString + 8);
        bVar32 = (pEVar9->super_Named).hasExplicitName;
        *(undefined8 *)auStack_148 = *(undefined8 *)&(pEVar9->super_Named).name.super_IString;
        ((Type *)((long)auStack_148 + 8))->id = (uintptr_t)pcVar7;
        *(bool *)&(((Name *)((long)auStack_148 + 0x10))->super_IString).str._M_len = bVar32;
        Module::addElementSegment
                  (this->secondary,
                   (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
                   auStack_148);
        std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
        ~unique_ptr((unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
                    auStack_148);
        psVar70 = &primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count;
      }
      std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
                ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)psVar70);
    }
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::Function_*>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::Function_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Function_*>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::Function_*>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::Function_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Function_*>_>_>
                 *)&secondary);
  }
  secondary = (__single_object *)&segmentReferrerCollector.field_0x28;
  segmentReferrerCollector.wasm._0_4_ = 1;
  segmentReferrerCollector.wasm._4_4_ = 0;
  segmentReferrerCollector._8_8_ = 0;
  segmentReferrerCollector._16_8_ = 0;
  segmentReferrerCollector._24_4_ = 0x3f800000;
  segmentReferrerCollector._32_8_ = 0;
  segmentReferrerCollector._40_8_ = 0;
  puVar12 = (this->primary->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar66 = (this->primary->exports).
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar66 != puVar12;
      puVar66 = puVar66 + 1) {
    pEVar38 = (puVar66->_M_t).
              super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
              super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
    if ((pEVar38->kind != Function) &&
       (*(__index_type *)
         ((long)&(pEVar38->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 0x10) == '\0'))
    {
      primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count =
           CONCAT44(primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
                    pEVar38->kind);
      segmentReferrers._M_h._M_buckets =
           *(__buckets_ptr *)
            &(pEVar38->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
             super__Move_assign_alias<wasm::Name,_wasm::HeapType>;
      segmentReferrers._M_h._M_bucket_count =
           *(size_type *)
            ((long)&(pEVar38->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 8);
      pmVar57 = std::__detail::
                _Map_base<std::pair<wasm::ExternalKind,_wasm::Name>,_std::pair<const_std::pair<wasm::ExternalKind,_wasm::Name>,_wasm::Name>,_std::allocator<std::pair<const_std::pair<wasm::ExternalKind,_wasm::Name>,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::ExternalKind,_wasm::Name>_>,_std::hash<std::pair<wasm::ExternalKind,_wasm::Name>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::pair<wasm::ExternalKind,_wasm::Name>,_std::pair<const_std::pair<wasm::ExternalKind,_wasm::Name>,_wasm::Name>,_std::allocator<std::pair<const_std::pair<wasm::ExternalKind,_wasm::Name>,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::ExternalKind,_wasm::Name>_>,_std::hash<std::pair<wasm::ExternalKind,_wasm::Name>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&secondary,
                             (key_type *)
                             &primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count);
      pcVar7 = *(char **)((long)&(pEVar38->name).super_IString + 8);
      (pmVar57->super_IString).str._M_len = *(size_t *)&(pEVar38->name).super_IString;
      (pmVar57->super_IString).str._M_str = pcVar7;
    }
  }
  puVar23 = (this->primary->memories).
            super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  psVar70 = &primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count;
  auStack_b8 = (undefined1  [8])this;
  primaryFuncs._M_t._M_impl._0_8_ =
       (_Map_base<std::pair<wasm::ExternalKind,_wasm::Name>,_std::pair<const_std::pair<wasm::ExternalKind,_wasm::Name>,_wasm::Name>,_std::allocator<std::pair<const_std::pair<wasm::ExternalKind,_wasm::Name>,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::ExternalKind,_wasm::Name>_>,_std::hash<std::pair<wasm::ExternalKind,_wasm::Name>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
        *)&secondary;
  for (puVar75 = (this->primary->memories).
                 super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar75 != puVar23;
      puVar75 = puVar75 + 1) {
    secondaryItem =
         wasm::ModuleUtils::copyMemory
                   ((puVar75->_M_t).
                    super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl,this->secondary);
    primaryItem = (puVar75->_M_t).
                  super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)psVar70,"memory",(allocator<char> *)auStack_128);
    shareImportableItems::anon_class_16_2_802485ec::operator()
              ((anon_class_16_2_802485ec *)auStack_b8,&primaryItem->super_Importable,
               &secondaryItem->super_Importable,(string *)psVar70,Memory);
    std::__cxx11::string::~string((string *)psVar70);
  }
  puVar6 = (this->primary->tables).
           super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar70 = &primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count;
  for (puVar40 = (this->primary->tables).
                 super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar40 != puVar6; puVar40 = puVar40 + 1
      ) {
    pTVar58 = Module::getTableOrNull
                        (this->secondary,
                         (IString)*(IString *)
                                   &(((puVar40->_M_t).
                                      super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                                      .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->
                                    super_Importable).super_Named);
    if (pTVar58 == (Table *)0x0) {
      pTVar58 = wasm::ModuleUtils::copyTable
                          ((puVar40->_M_t).
                           super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                           super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl,this->secondary)
      ;
    }
    primaryItem_00 =
         (puVar40->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
         super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)psVar70,"table",(allocator<char> *)auStack_128);
    shareImportableItems::anon_class_16_2_802485ec::operator()
              ((anon_class_16_2_802485ec *)auStack_b8,&primaryItem_00->super_Importable,
               &pTVar58->super_Importable,(string *)psVar70,Table);
    std::__cxx11::string::~string((string *)psVar70);
  }
  puVar77 = (this->primary->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar17 = (this->primary->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  psVar70 = &primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count;
  while( true ) {
    if (puVar77 == puVar17) {
      puVar24 = (this->primary->tags).
                super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      psVar70 = &primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count;
      for (puVar78 = (this->primary->tags).
                     super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar78 != puVar24;
          puVar78 = puVar78 + 1) {
        std::make_unique<wasm::Tag>();
        auVar50 = auStack_128;
        primaryItem_01 =
             (puVar78->_M_t).super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
             super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl;
        *(pointer *)((long)auStack_128 + 0x38) = (pointer)(primaryItem_01->type).id;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)psVar70,"tag",(allocator<char> *)auStack_148);
        shareImportableItems::anon_class_16_2_802485ec::operator()
                  ((anon_class_16_2_802485ec *)auStack_b8,&primaryItem_01->super_Importable,
                   (Importable *)auVar50,(string *)psVar70,Tag);
        std::__cxx11::string::~string((string *)psVar70);
        Module::addTag(this->secondary,
                       (unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)auStack_128);
        std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::~unique_ptr
                  ((unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)auStack_128);
      }
      std::
      _Hashtable<std::pair<wasm::ExternalKind,_wasm::Name>,_std::pair<const_std::pair<wasm::ExternalKind,_wasm::Name>,_wasm::Name>,_std::allocator<std::pair<const_std::pair<wasm::ExternalKind,_wasm::Name>,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::ExternalKind,_wasm::Name>_>,_std::hash<std::pair<wasm::ExternalKind,_wasm::Name>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::pair<wasm::ExternalKind,_wasm::Name>,_std::pair<const_std::pair<wasm::ExternalKind,_wasm::Name>,_wasm::Name>,_std::allocator<std::pair<const_std::pair<wasm::ExternalKind,_wasm::Name>,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::ExternalKind,_wasm::Name>_>,_std::hash<std::pair<wasm::ExternalKind,_wasm::Name>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&secondary);
      PassRunner::PassRunner((PassRunner *)&secondary,this->secondary);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)auStack_b8,"remove-unused-module-elements",(allocator<char> *)auStack_128
                );
      segmentReferrers._M_h._M_element_count =
           segmentReferrers._M_h._M_element_count & 0xffffffffffffff00;
      PassRunner::add((PassRunner *)&secondary,(string *)auStack_b8,
                      (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&primaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string((string *)auStack_b8);
      PassRunner::run((PassRunner *)&secondary);
      PassRunner::~PassRunner((PassRunner *)&secondary);
      return;
    }
    if ((((puVar77->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
          _M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
          super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->mutable_ == true) &&
       (((this->primary->features).features & 2) == 0)) break;
    std::make_unique<wasm::Global>();
    pGVar18 = (puVar77->_M_t).
              super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
              super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
    *(pointer *)((long)auStack_128 + 0x38) = (pointer)(pGVar18->type).id;
    *(bool *)&(((vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                 *)((long)auStack_128 + 0x48))->
              super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start = pGVar18->mutable_;
    if (pGVar18->init == (Expression *)0x0) {
      puVar59 = (pointer)0x0;
    }
    else {
      iVar34 = ExpressionManipulator::copy
                         ((EVP_PKEY_CTX *)pGVar18->init,(EVP_PKEY_CTX *)this->secondary);
      puVar59 = (pointer)CONCAT44(extraout_var_01,iVar34);
    }
    auVar50 = auStack_128;
    *(pointer *)((long)auStack_128 + 0x40) = puVar59;
    pGVar18 = (puVar77->_M_t).
              super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
              super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)psVar70,"global",(allocator<char> *)auStack_148);
    shareImportableItems::anon_class_16_2_802485ec::operator()
              ((anon_class_16_2_802485ec *)auStack_b8,&pGVar18->super_Importable,
               (Importable *)auVar50,(string *)psVar70,Global);
    std::__cxx11::string::~string((string *)psVar70);
    Module::addGlobal(this->secondary,
                      (unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)auStack_128);
    std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr
              ((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)auStack_128);
    puVar77 = puVar77 + 1;
  }
  __assert_fail("primary.features.hasMutableGlobals() && \"TODO: add wrapper functions for disallowed mutable globals\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-splitting.cpp"
                ,0x369,
                "void wasm::ModuleSplitting::(anonymous namespace)::ModuleSplitter::shareImportableItems()"
               );
}

Assistant:

ModuleSplitter(Module& primary, const Config& config)
    : config(config), secondaryPtr(initSecondary(primary)), primary(primary),
      secondary(*secondaryPtr),
      classifiedFuncs(classifyFunctions(primary, config)),
      primaryFuncs(classifiedFuncs.first),
      secondaryFuncs(classifiedFuncs.second), tableManager(primary),
      exportedPrimaryFuncs(initExportedPrimaryFuncs(primary)) {
    if (config.jspi) {
      setupJSPI();
    }
    moveSecondaryFunctions();
    thunkExportedSecondaryFunctions();
    indirectReferencesToSecondaryFunctions();
    indirectCallsToSecondaryFunctions();
    exportImportCalledPrimaryFunctions();
    setupTablePatching();
    shareImportableItems();
    removeUnusedSecondaryElements();
  }